

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_2i_sparc
               (TCGContext_conflict7 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz,int64_t c,GVecGen2i_conflict7 *g)

{
  byte bVar1;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_int64_t_conflict7 *p_Var2;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_int32_t_conflict7 *p_Var3;
  TCGType_conflict TVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  uintptr_t o;
  uint32_t uVar7;
  TCGArg TVar8;
  int32_t data;
  uintptr_t o_1;
  TCGv_i64 pTVar9;
  uint uVar10;
  uintptr_t o_3;
  _Bool _Var11;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_int64_t_conflict7 *fni;
  
  if (g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_int64_t_conflict7 *)0x0) {
switchD_009fd81d_caseD_0:
    if (((oprsz - 8 < 0x20) && ((oprsz & 7) == 0)) &&
       (p_Var2 = g->fni8,
       p_Var2 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_int64_t_conflict7 *)0x0)) {
      _Var11 = g->load_dest;
      uVar10 = 0;
      pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_I64,false);
      pTVar6 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_I64,false);
      pTVar9 = (TCGv_i64)((long)pTVar6 - (long)tcg_ctx);
      do {
        tcg_gen_op3_sparc(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar5,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar10));
        if (_Var11 == false) {
          TVar8 = (TCGArg)(dofs + uVar10);
        }
        else {
          TVar8 = (TCGArg)(dofs + uVar10);
          tcg_gen_op3_sparc(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar6,
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),TVar8);
        }
        (*p_Var2)(tcg_ctx,pTVar9,(TCGv_i64)((long)pTVar5 - (long)tcg_ctx),c);
        tcg_gen_op3_sparc(tcg_ctx,INDEX_op_st_i64,(TCGArg)pTVar6,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),TVar8);
        uVar10 = uVar10 + 8;
      } while (uVar10 < oprsz);
      tcg_temp_free_internal_sparc
                (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar5 - (long)tcg_ctx) + (long)tcg_ctx));
    }
    else {
      data = (int32_t)c;
      if (((0xf < oprsz - 4) || ((oprsz & 3) != 0)) ||
         (p_Var3 = g->fni4,
         p_Var3 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_int32_t_conflict7 *)0x0)) {
        if (g->fno != (gen_helper_gvec_2_conflict7 *)0x0) {
          tcg_gen_gvec_2_ool_sparc(tcg_ctx,dofs,aofs,oprsz,maxsz,data,g->fno);
          return;
        }
        pTVar9 = tcg_const_i64_sparc(tcg_ctx,c);
        tcg_gen_gvec_2i_ool_sparc(tcg_ctx,dofs,aofs,pTVar9,oprsz,maxsz,data,g->fnoi);
        tcg_temp_free_internal_sparc(tcg_ctx,(TCGTemp *)(pTVar9 + (long)tcg_ctx));
        return;
      }
      _Var11 = g->load_dest;
      uVar10 = 0;
      pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_I32,false);
      pTVar6 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_I32,false);
      pTVar9 = (TCGv_i64)((long)pTVar6 - (long)tcg_ctx);
      do {
        tcg_gen_op3_sparc(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar5,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar10));
        if (_Var11 == false) {
          TVar8 = (TCGArg)(dofs + uVar10);
        }
        else {
          TVar8 = (TCGArg)(dofs + uVar10);
          tcg_gen_op3_sparc(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar6,
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),TVar8);
        }
        (*p_Var3)(tcg_ctx,(TCGv_i32)pTVar9,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),data);
        tcg_gen_op3_sparc(tcg_ctx,INDEX_op_st_i32,(TCGArg)pTVar6,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),TVar8);
        uVar10 = uVar10 + 4;
      } while (uVar10 < oprsz);
      tcg_temp_free_internal_sparc
                (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)pTVar5 - (long)tcg_ctx) + (long)tcg_ctx));
    }
    tcg_temp_free_internal_sparc(tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)pTVar9));
  }
  else {
    TVar4 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64);
    switch(TVar4) {
    case TCG_TYPE_I32:
      goto switchD_009fd81d_caseD_0;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                 ,0x47c,(char *)0x0);
    case TCG_TYPE_V64:
      bVar1 = g->vece;
      _Var11 = g->load_dest;
      uVar7 = 8;
      fni = g->fniv;
      TVar4 = TCG_TYPE_V64;
      break;
    case TCG_TYPE_V256:
      uVar10 = oprsz & 0xffffffe0;
      expand_2i_vec(tcg_ctx,(uint)g->vece,dofs,aofs,uVar10,0x20,TCG_TYPE_V256,c,g->load_dest,g->fniv
                   );
      if (uVar10 == oprsz) goto LAB_009fdb39;
      dofs = dofs + uVar10;
      aofs = aofs + uVar10;
      oprsz = oprsz & 0x1f;
      maxsz = maxsz - uVar10;
    case TCG_TYPE_V128:
      bVar1 = g->vece;
      _Var11 = g->load_dest;
      uVar7 = 0x10;
      fni = g->fniv;
      TVar4 = TCG_TYPE_V128;
    }
    expand_2i_vec(tcg_ctx,(uint)bVar1,dofs,aofs,oprsz,uVar7,TVar4,c,_Var11,fni);
  }
LAB_009fdb39:
  uVar7 = maxsz - oprsz;
  if (oprsz <= maxsz && uVar7 != 0) {
    do_dup(tcg_ctx,0,dofs + oprsz,uVar7,uVar7,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
  }
  return;
}

Assistant:

void tcg_gen_gvec_2i(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                     uint32_t maxsz, int64_t c, const GVecGen2i *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, some, 32, TCG_TYPE_V256,
                      c, g->load_dest, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128,
                      c, g->load_dest, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64,
                      c, g->load_dest, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_2i_i64(tcg_ctx, dofs, aofs, oprsz, c, g->load_dest, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_2i_i32(tcg_ctx, dofs, aofs, oprsz, c, g->load_dest, g->fni4);
        } else {
            if (g->fno) {
                tcg_gen_gvec_2_ool(tcg_ctx, dofs, aofs, oprsz, maxsz, c, g->fno);
            } else {
                TCGv_i64 tcg_c = tcg_const_i64(tcg_ctx, c);
                tcg_gen_gvec_2i_ool(tcg_ctx, dofs, aofs, tcg_c, oprsz,
                                    maxsz, c, g->fnoi);
                tcg_temp_free_i64(tcg_ctx, tcg_c);
            }
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}